

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O1

Image<float,_gimage::PixelTraits<float>_> *
gimage::medianDownscaleImage<float>
          (Image<float,_gimage::PixelTraits<float>_> *__return_storage_ptr__,
          Image<float,_gimage::PixelTraits<float>_> *image,int factor)

{
  long lVar1;
  int iVar2;
  long lVar3;
  float ***pppfVar4;
  pointer __first;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int ii;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  vector<float,_std::allocator<float>_> v;
  allocator_type local_89;
  long local_88;
  Image<float,_gimage::PixelTraits<float>_> *local_80;
  ulong local_78;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_70;
  ulong local_68;
  value_type_conflict2 local_5c;
  ulong local_58;
  Image<float,_gimage::PixelTraits<float>_> *local_50;
  vector<float,_std::allocator<float>_> local_48;
  
  uVar13 = 1;
  if (1 < factor) {
    uVar13 = (ulong)(uint)factor;
  }
  lVar6 = image->width;
  lVar3 = image->height;
  iVar2 = image->depth;
  __return_storage_ptr__->depth = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->pixel = (float *)0x0;
  __return_storage_ptr__->row = (float **)0x0;
  __return_storage_ptr__->img = (float ***)0x0;
  local_80 = __return_storage_ptr__;
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (__return_storage_ptr__,(long)(lVar6 + (uVar13 - 1)) / (long)uVar13,
             (long)((uVar13 - 1) + lVar3) / (long)uVar13,(long)iVar2);
  local_5c = 0.0;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_48,(ulong)(uint)((int)uVar13 * (int)uVar13),&local_5c,&local_89);
  if (0 < image->depth) {
    local_88 = 0;
    local_50 = image;
    do {
      if (0 < image->height) {
        local_78 = 0;
        do {
          lVar6 = image->width;
          if (0 < lVar6) {
            local_58 = local_78 / uVar13;
            uVar10 = 0;
            do {
              __first = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start;
              local_70._M_current = (float *)image->height;
              uVar7 = 0;
              uVar9 = 0;
              do {
                lVar3 = local_78 + uVar7;
                if ((long)local_70._M_current <= lVar3) break;
                uVar8 = image->depth;
                pppfVar4 = image->img;
                uVar11 = 0;
                do {
                  lVar1 = uVar11 + uVar10;
                  if (lVar6 <= lVar1) break;
                  bVar14 = (int)uVar8 < 1;
                  if ((int)uVar8 < 1) {
LAB_0012ce15:
                    if (bVar14) {
                      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar9] =
                           pppfVar4[local_88][lVar3][lVar1];
                      uVar9 = (ulong)((int)uVar9 + 1);
                    }
                  }
                  else if ((uint)ABS((*pppfVar4)[lVar3][lVar1]) < 0x7f800000) {
                    uVar5 = 1;
                    do {
                      uVar12 = uVar5;
                      if (uVar8 == uVar12) break;
                      uVar5 = uVar12 + 1;
                    } while ((uint)ABS(pppfVar4[uVar12][lVar3][lVar1]) < 0x7f800000);
                    bVar14 = uVar8 <= uVar12;
                    goto LAB_0012ce15;
                  }
                  uVar11 = uVar11 + 1;
                } while (uVar11 != uVar13);
                uVar7 = uVar7 + 1;
                image = local_50;
              } while (uVar7 != uVar13);
              local_68 = uVar10 / uVar13;
              local_80->img[local_88][local_58][local_68] = INFINITY;
              if (0 < (int)(uint)uVar9) {
                uVar8 = (uint)uVar9 >> 1;
                local_70._M_current =
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar8;
                std::
                __heap_select<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,local_70._M_current,
                           local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar9);
                std::
                __sort_heap<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
                          ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
                           __first,local_70,(_Iter_less_iter *)&local_5c);
                local_80->img[local_88][local_58][local_68] =
                     local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8];
              }
              uVar10 = uVar10 + uVar13;
              lVar6 = image->width;
            } while ((long)uVar10 < lVar6);
          }
          local_78 = local_78 + uVar13;
        } while ((long)local_78 < image->height);
      }
      local_88 = local_88 + 1;
    } while (local_88 < image->depth);
  }
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return local_80;
}

Assistant:

Image<T> medianDownscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  std::vector<T> v(factor*factor, 0);

  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k+=factor)
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        int n=0;

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValid(i+ii, k+kk))
            {
              v[n]=image.get(i+ii, k+kk, d);
              n++;
            }
          }
        }

        ret.setInvalid(i/factor, k/factor, d);

        if (n > 0)
        {
          partial_sort(v.begin(), v.begin()+(n>>1), v.begin()+n);
          ret.set(i/factor, k/factor, d, v[n>>1]);
        }
      }
    }
  }

  return ret;
}